

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkpp.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
pg::ZLKPPSolver::solve
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ZLKPPSolver *this,
          int max_priority,int prec_cur,int prec_opo,bool *reached_bottom_cur,
          bool *reached_bottom_opo)

{
  bool bVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> saved_nodes;
  bool local_8d;
  int local_8c;
  vector<int,_std::allocator<int>_> *local_88;
  int local_7c;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  if (this->cur_num_nodes == 0) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_88 = __return_storage_ptr__;
    get_cur_nodes(&local_78,this);
    iVar2 = this->variant;
    if (iVar2 == 2) {
      solve_liverpool(this,max_priority,prec_cur,prec_opo,reached_bottom_cur,reached_bottom_opo);
    }
    else if (iVar2 == 1) {
      iVar2 = prec_opo / 2;
      local_7c = prec_opo;
      do {
        local_8d = false;
        bVar1 = do_step(this,max_priority,prec_cur,iVar2,&local_8c,reached_bottom_cur,&local_8d);
        *reached_bottom_opo = (bool)(*reached_bottom_opo | local_8d);
      } while (bVar1);
      if (((iVar2 < local_8c) && (local_8d != false)) &&
         (bVar1 = do_step(this,max_priority,prec_cur,local_7c,&local_8c,reached_bottom_cur,
                          reached_bottom_opo), bVar1)) {
        do {
          bVar1 = do_step(this,max_priority,prec_cur,iVar2,&local_8c,reached_bottom_cur,
                          reached_bottom_opo);
        } while (bVar1);
      }
    }
    else if (iVar2 == 0) {
      do {
        bVar1 = do_step(this,max_priority,prec_cur,prec_opo,&local_8c,reached_bottom_cur,
                        reached_bottom_opo);
      } while (bVar1);
    }
    get_nodes_of_max_priority(&local_48,this,max_priority);
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    get_cur_nodes(local_88,this);
    std::vector<int,_std::allocator<int>_>::vector(&local_60,&local_78);
    set_cur_nodes(this,&local_60);
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    __return_storage_ptr__ = local_88;
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      __return_storage_ptr__ = local_88;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> ZLKPPSolver::solve(int max_priority, int prec_cur, int prec_opo, bool &reached_bottom_cur, bool &reached_bottom_opo) {
    if (!cur_num_nodes)
        return std::vector<int>();
    auto saved_nodes = get_cur_nodes();
    int num_nodes_in_h;
    switch (variant) {

    case ZLK_STANDARD:
        while (do_step(max_priority, prec_cur, prec_opo, num_nodes_in_h, reached_bottom_cur, reached_bottom_opo));
        break;

    case ZLK_WARSAW:
        bool reached_bottom_opo_last, atr_greater;
        atr_greater = true;
        while (atr_greater) {
            reached_bottom_opo_last = false;
            atr_greater = do_step(max_priority, prec_cur, prec_opo / 2, num_nodes_in_h, reached_bottom_cur, reached_bottom_opo_last);
            reached_bottom_opo |= reached_bottom_opo_last;
        }
        if (num_nodes_in_h <= prec_opo / 2 || !reached_bottom_opo_last)
            break;
        if (do_step(max_priority, prec_cur, prec_opo, num_nodes_in_h, reached_bottom_cur, reached_bottom_opo))
            while (do_step(max_priority, prec_cur, prec_opo / 2, num_nodes_in_h, reached_bottom_cur, reached_bottom_opo));
        break;
    
    case ZLK_LIVERPOOL:
        solve_liverpool(max_priority, prec_cur, prec_opo, reached_bottom_cur, reached_bottom_opo);
        break;
    }
    
    // we should set strategy in nodes of maximal priority to an arbitrary node that remains in the subgame now:
    get_nodes_of_max_priority(max_priority);

    auto winning_region = get_cur_nodes();
    set_cur_nodes(saved_nodes); // the current game remains unchanged at the end
    return winning_region;
}